

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_function_primitive_recompileAndOptimize
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  uint uVar4;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  puVar1 = (ulong *)*arguments;
  if (((((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0) &&
      (uVar2 = *puVar1, (uVar2 & 0xf) == 0 && uVar2 != 0)) && ((*(byte *)(uVar2 + 8) & 0x80) == 0))
  {
    uVar2 = *(ulong *)(uVar2 + 0x70);
    if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
      uVar4 = (uint)((long)uVar2 >> 4);
    }
    else {
      uVar4 = (uint)*(undefined8 *)(uVar2 + 0x10);
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      if (((puVar1[9] != 0) && (uVar2 = puVar1[7], (uVar2 & 0xf) == 0 && uVar2 != 0)) &&
         (7 < *(uint *)(uVar2 + 0xc))) {
        sVar3 = sysbvm_interpreter_recompileAndOptimizeFunction
                          (context,(sysbvm_function_t **)arguments);
        return sVar3;
      }
      return (sysbvm_tuple_t)puVar1;
    }
  }
  sysbvm_error("Expected a function.");
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_recompileAndOptimize(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    if((*functionObject)->definition && sysbvm_array_getSize((*functionObject)->captureVector) > 0)
        return sysbvm_interpreter_recompileAndOptimizeFunction(context, functionObject);
    
    return *function;
}